

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiWindowSettings * ImGui::FindWindowSettings(ImGuiID id)

{
  ImGuiContext *pIVar1;
  ImGuiWindowSettings *pIVar2;
  int local_24;
  int i;
  ImGuiContext *g;
  ImGuiID id_local;
  
  pIVar1 = GImGui;
  local_24 = 0;
  while( true ) {
    if (local_24 == (pIVar1->SettingsWindows).Size) {
      return (ImGuiWindowSettings *)0x0;
    }
    pIVar2 = ImVector<ImGuiWindowSettings>::operator[](&pIVar1->SettingsWindows,local_24);
    if (pIVar2->ID == id) break;
    local_24 = local_24 + 1;
  }
  pIVar2 = ImVector<ImGuiWindowSettings>::operator[](&pIVar1->SettingsWindows,local_24);
  return pIVar2;
}

Assistant:

ImGuiWindowSettings* ImGui::FindWindowSettings(ImGuiID id)
{
    ImGuiContext& g = *GImGui;
    for (int i = 0; i != g.SettingsWindows.Size; i++)
        if (g.SettingsWindows[i].ID == id)
            return &g.SettingsWindows[i];
    return NULL;
}